

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgrdma.c
# Opt level: O2

unsigned_long get_next_value(void)

{
  int iVar1;
  unsigned_long value;
  
  iVar1 = get_next_word(&value);
  if (iVar1 == 0) {
    if (echo_data == '\x01') {
      printf("# 0x%08lx\n",value);
    }
    return value;
  }
  fwrite("unexpected end of file!\n",0x18,1,_stderr);
  exit(1);
}

Assistant:

static unsigned long get_next_value(void)
{
	unsigned long value;

	if (get_next_word(&value)) {
		fprintf(stderr, "unexpected end of file!\n");
		exit(1);
	}

	if (echo_data)
		printf("# 0x%08lx\n", value);

	return value;
}